

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgcep.cc
# Opt level: O3

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  size_t sVar7;
  char *__s;
  istream *input_stream;
  long lVar8;
  int num_order;
  int fft_length;
  int impulse_response_length;
  int num_iteration;
  double alpha;
  double gamma;
  double relative_floor_in_decibels;
  double epsilon;
  double convergence_threshold;
  double power;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  ostringstream error_message_17;
  vector<double,_std::allocator<double>_> output;
  MelGeneralizedCepstralAnalysis analysis;
  Buffer buffer_for_power_normalization;
  GeneralizedCepstrumGainNormalization generalized_cepstrum_gain_normalization;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  Buffer buffer_for_cepstral_analysis;
  Buffer buffer_for_spectral_analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  ifstream ifs;
  MelCepstrumPowerNormalization mel_cepstrum_power_normalization;
  WaveformToSpectrum waveform_to_spectrum;
  int local_1210;
  int local_120c;
  string local_1208;
  InputOutputFormats local_11e4;
  int local_11e0;
  int local_11dc;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  ulong local_11b8;
  double local_11b0;
  double local_11a8;
  vector<double,_std::allocator<double>_> local_11a0;
  vector<double,_std::allocator<double>_> local_1188;
  allocator_type local_1170 [112];
  ios_base local_1100 [264];
  vector<double,_std::allocator<double>_> local_ff8;
  MelGeneralizedCepstralAnalysis local_fe0;
  undefined1 local_d78 [32];
  pointer pdStack_d58;
  pointer local_d50;
  pointer pdStack_d48;
  undefined **local_d40;
  pointer local_d38;
  pointer pdStack_d30;
  pointer local_d28;
  undefined **local_d20;
  pointer local_d18;
  pointer pdStack_d10;
  pointer local_d08;
  pointer pdStack_d00;
  pointer local_cf8;
  pointer pdStack_cf0;
  undefined **local_ce8;
  pointer local_ce0;
  pointer pdStack_cd8;
  pointer local_cd0;
  pointer pdStack_cc8;
  pointer local_cc0;
  pointer pdStack_cb8;
  GeneralizedCepstrumGainNormalization local_cb0;
  MelCepstrumToMlsaDigitalFilterCoefficients local_c90;
  undefined1 local_c70 [1936];
  Buffer local_4e0;
  SpectrumToSpectrum local_420;
  InputOutputFormats local_3d8;
  undefined4 uStack_3d4;
  byte abStack_3b8 [488];
  MelCepstrumPowerNormalization local_1d0;
  WaveformToSpectrum local_120;
  
  local_1210 = 0x19;
  local_11d8 = 0.35;
  local_11d0 = 0.0;
  local_120c = 0x100;
  local_11dc = 0x1e;
  local_11b0 = 0.001;
  local_11b8 = 0;
  local_11c0 = 0.0;
  local_11c8 = -1.79769313486232e+308;
  local_11e0 = 0x80;
  local_11e4 = kNumInputOutputFormats;
  do {
    iVar4 = ya_getopt_long(argc,argv,"m:a:g:c:l:q:o:i:d:e:E:n:h",(option *)0x0,(int *)0x0);
    input_format = local_11e4;
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToDouble((string *)local_c70,&local_11d8);
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_11d8);
        if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
          operator_delete((void *)local_c70._0_8_);
        }
        if (bVar2) break;
      }
      else if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"The argument for the -a option must be in (-1.0, 1.0)",0x35);
      local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
      goto LAB_001058be;
    case 0x62:
    case 0x66:
    case 0x6a:
    case 0x6b:
    case 0x70:
switchD_00104bce_caseD_62:
      anon_unknown.dwarf_438b::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 99:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,(int *)&local_3d8);
      bVar1 = (int)local_3d8 < 0;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -c option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"non-negative integer",0x14);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      local_11d0 = 0.0;
      if (local_3d8 != kLogAmplitudeSpectrumInDecibels) {
        local_11d0 = -1.0 / (double)(int)local_3d8;
      }
      break;
    case 100:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar1 = sptk::ConvertStringToDouble((string *)local_c70,&local_11b0);
      bVar2 = local_11b0 < 0.0;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,
                   "The argument for the -d option must be a non-negative number",0x3c);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x65:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar1 = sptk::ConvertStringToDouble((string *)local_c70,&local_11c0);
      bVar2 = local_11c0 <= 0.0;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -e option must be a positive number",
                   0x38);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x67:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToDouble((string *)local_c70,&local_11d0);
      if (bVar2) {
        bVar2 = sptk::IsValidGamma(local_11d0);
        if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
          operator_delete((void *)local_c70._0_8_);
        }
        if (bVar2) break;
      }
      else if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"The argument for the -g option must be in [-1.0, 0.0]",0x35);
      local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
      goto LAB_001058be;
    case 0x68:
      anon_unknown.dwarf_438b::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,&local_11dc);
      bVar1 = local_11dc < 0;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,
                   "The argument for the -i option must be a non-negative integer",0x3d);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,&local_120c);
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -l option must be an integer",0x31);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,&local_1210);
      bVar1 = local_1210 < 0;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"non-negative integer",0x14);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar1 = sptk::ConvertStringToInteger((string *)local_c70,&local_11e0);
      bVar2 = local_11e0 < 1;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -n option must be a positive integer",
                   0x39);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
        goto LAB_001058be;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,(int *)&local_3d8);
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d8,0,4);
        if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
          operator_delete((void *)local_c70._0_8_);
        }
        if (bVar2) {
          local_11b8 = (ulong)local_3d8;
          break;
        }
      }
      else if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_c70,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,4);
      local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
      goto LAB_001058be;
    case 0x71:
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c70,(int *)&local_3d8);
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d8,0,4);
        if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
          operator_delete((void *)local_c70._0_8_);
        }
        if (bVar2) {
          local_11e4 = local_3d8;
          break;
        }
      }
      else if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c70,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_c70,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,4);
      local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
      goto LAB_001058be;
    default:
      if (iVar4 != 0x45) {
        if (iVar4 != -1) goto switchD_00104bce_caseD_62;
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_c70,"Too many input files",0x14);
          local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
          goto LAB_001058be;
        }
        if (argc == ya_optind) {
          __s = (char *)0x0;
        }
        else {
          __s = argv[ya_optind];
        }
        bVar2 = sptk::SetBinaryMode();
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_c70,"Cannot set translation mode",0x1b);
          local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
          goto LAB_001058be;
        }
        input_stream = (istream *)&local_3d8;
        std::ifstream::ifstream(input_stream);
        if ((__s != (char *)0x0) &&
           (std::ifstream::open((char *)&local_3d8,(_Ios_Openmode)__s),
           (abStack_3b8[*(long *)(CONCAT44(uStack_3d4,local_3d8) + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_c70,"Cannot open file ",0x11);
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c70,__s,sVar7);
          local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
          if (local_fe0._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_fe0.alpha_) {
            operator_delete(local_fe0._vptr_MelGeneralizedCepstralAnalysis);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c70);
          std::ios_base::~ios_base((ios_base *)(local_c70 + 0x70));
          iVar4 = 1;
          goto LAB_00106053;
        }
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          input_stream = (istream *)&std::cin;
        }
        sptk::SpectrumToSpectrum::SpectrumToSpectrum
                  (&local_420,local_120c,input_format,kPowerSpectrum,local_11c0,local_11c8);
        if ((input_format != kNumInputOutputFormats) && (local_420.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_c70,"Failed to set condition for input formatting",0x2c);
          local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
          if (local_fe0._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_fe0.alpha_) {
            operator_delete(local_fe0._vptr_MelGeneralizedCepstralAnalysis);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c70);
          std::ios_base::~ios_base((ios_base *)(local_c70 + 0x70));
          iVar4 = 1;
          goto LAB_00106046;
        }
        sptk::WaveformToSpectrum::WaveformToSpectrum
                  (&local_120,local_120c,local_120c,kPowerSpectrum,local_11c0,local_11c8);
        local_4e0._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1c8;
        local_4e0.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1f8;
        local_4e0.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
             (_func_int **)&PTR__Buffer_0011f228;
        memset(&local_4e0.buffer_.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
        if ((input_format == kNumInputOutputFormats) &&
           (local_120.filter_coefficients_to_spectrum_.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_c70,"Failed to set condition for spectral analysis",0x2d);
          local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
          if (local_fe0._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_fe0.alpha_) {
            operator_delete(local_fe0._vptr_MelGeneralizedCepstralAnalysis);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c70);
          std::ios_base::~ios_base((ios_base *)(local_c70 + 0x70));
          iVar4 = 1;
          goto LAB_00106029;
        }
        sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
                  (&local_fe0,local_120c,local_1210,local_11d8,local_11d0,local_11dc,local_11b0);
        sptk::MelGeneralizedCepstralAnalysis::Buffer::Buffer((Buffer *)local_c70);
        if (local_fe0.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1170,"Failed to set condition for cepstral analysis",0x2d);
          local_d78._0_8_ = local_d78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"mgcep","");
          sptk::PrintErrorMessage((string *)local_d78,(ostringstream *)local_1170);
        }
        else {
          sptk::MelCepstrumToMlsaDigitalFilterCoefficients::
          MelCepstrumToMlsaDigitalFilterCoefficients(&local_c90,local_1210,local_11d8);
          if (local_c90.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1170,"Failed to set condition for output formatting",0x2d);
            local_d78._0_8_ = local_d78 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"mgcep","");
            sptk::PrintErrorMessage((string *)local_d78,(ostringstream *)local_1170);
          }
          else {
            sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                      (&local_cb0,local_1210,local_11d0);
            if (local_cb0.is_valid_ != false) {
              sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
                        (&local_1d0,local_1210,local_11e0,local_11d8);
              local_d78._0_8_ = &PTR__Buffer_0011f378;
              local_d78._8_8_ = (pointer)0x0;
              local_d78._16_8_ = (pointer)0x0;
              local_d78._24_8_ = (pointer)0x0;
              pdStack_d58 = (pointer)0x0;
              local_d50 = (pointer)0x0;
              pdStack_d48 = (pointer)0x0;
              local_d40 = &PTR__Buffer_0011f318;
              local_d38 = (pointer)0x0;
              pdStack_d30 = (pointer)0x0;
              local_d28 = (pointer)0x0;
              local_d20 = &PTR__Buffer_0011f3a8;
              local_d18 = (pointer)0x0;
              pdStack_d10 = (pointer)0x0;
              local_d08 = (pointer)0x0;
              pdStack_d00 = (pointer)0x0;
              local_cf8 = (pointer)0x0;
              pdStack_cf0 = (pointer)0x0;
              local_ce8 = &PTR__Buffer_0011f228;
              local_ce0 = (pointer)0x0;
              pdStack_cd8 = (pointer)0x0;
              local_cd0 = (pointer)0x0;
              pdStack_cc8 = (pointer)0x0;
              local_cc0 = (pointer)0x0;
              pdStack_cb8 = (pointer)0x0;
              if (local_1d0.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1170,"Failed to set condition for power normalization",
                           0x2f);
                local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
                sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
                  operator_delete(local_1208._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
                std::ios_base::~ios_base(local_1100);
                iVar4 = 1;
                goto LAB_00106400;
              }
              iVar4 = local_120c;
              if (input_format != kNumInputOutputFormats) {
                iVar4 = local_120c / 2 + 1;
              }
              lVar8 = (long)local_1210;
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_1188,(long)iVar4,local_1170);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_11a0,(long)(local_120c / 2 + 1),local_1170);
              std::vector<double,_std::allocator<double>_>::vector(&local_ff8,lVar8 + 1U,local_1170)
              ;
              uVar5 = (uint)local_11b8;
              goto LAB_00105bb2;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1170,"Failed to set condition for gain normalization",0x2e);
            local_d78._0_8_ = local_d78 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"mgcep","");
            sptk::PrintErrorMessage((string *)local_d78,(ostringstream *)local_1170);
          }
        }
        if ((undefined1 *)local_d78._0_8_ != local_d78 + 0x10) {
          operator_delete((void *)local_d78._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
        std::ios_base::~ios_base(local_1100);
        iVar4 = 1;
        goto LAB_0010600f;
      }
      std::__cxx11::string::string((string *)local_c70,ya_optarg,(allocator *)&local_fe0);
      bVar1 = sptk::ConvertStringToDouble((string *)local_c70,&local_11c8);
      bVar2 = 0.0 <= local_11c8;
      if ((undefined1 *)local_c70._0_8_ != local_c70 + 0x10) {
        operator_delete((void *)local_c70._0_8_);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c70,"The argument for the -E option must be a negative number",
                   0x38);
        local_fe0._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_fe0.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_fe0,(ostringstream *)local_c70);
LAB_001058be:
        if (local_fe0._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_fe0.alpha_) {
          operator_delete(local_fe0._vptr_MelGeneralizedCepstralAnalysis);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c70);
        std::ios_base::~ios_base((ios_base *)(local_c70 + 0x70));
        return 1;
      }
    }
  } while( true );
LAB_00105bb2:
  do {
    bVar2 = sptk::ReadStream<double>(false,0,0,iVar4,&local_1188,input_stream,(int *)0x0);
    if (!bVar2) {
      iVar4 = 0;
      goto LAB_001063be;
    }
    if (local_11e4 == kNumInputOutputFormats) {
      bVar2 = sptk::WaveformToSpectrum::Run(&local_120,&local_1188,&local_11a0,&local_4e0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to transform waveform to spectrum",0x28);
        local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
        sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
        goto LAB_00106389;
      }
    }
    else {
      bVar2 = sptk::SpectrumToSpectrum::Run(&local_420,&local_1188,&local_11a0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to convert spectrum",0x1a);
        local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
        sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
        goto LAB_00106389;
      }
    }
    bVar2 = sptk::MelGeneralizedCepstralAnalysis::Run
                      (&local_fe0,&local_11a0,&local_ff8,(Buffer *)local_c70);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1170,"Failed to run mel-generalized cepstral analysis",0x2f);
      local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
      sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
      goto LAB_00106389;
    }
    if ((local_11d8 != 0.0 && (uVar5 & 0xfffffffd) == 1) &&
       (bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run(&local_c90,&local_ff8), !bVar2
       )) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1170,"Failed to convert to MLSA filter coefficients",0x2d);
      local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
      sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
      goto LAB_00106389;
    }
    if ((uVar5 & 0xfffffffe) == 2) {
      bVar2 = sptk::GeneralizedCepstrumGainNormalization::Run(&local_cb0,&local_ff8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to gain-normalize cepstrum",0x21);
        local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
        sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
        goto LAB_00106389;
      }
    }
    else if ((int)local_11b8 == 4) {
      bVar2 = sptk::MelCepstrumPowerNormalization::Run
                        (&local_1d0,&local_ff8,&local_11a8,(Buffer *)local_d78);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to power-normalize cepstrum",0x22);
        local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
        sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
        goto LAB_00106389;
      }
      bVar2 = sptk::WriteStream<double>(local_11a8,(ostream *)&std::cout);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to write power",0x15);
        local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
        sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
        goto LAB_00106389;
      }
    }
    bVar2 = sptk::WriteStream<double>
                      (0,(int)(lVar8 + 1U),&local_ff8,(ostream *)&std::cout,(int *)0x0);
  } while (bVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1170,"Failed to write mel-generalized cepstrum",0x28);
  local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
  sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
LAB_00106389:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    operator_delete(local_1208._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
  std::ios_base::~ios_base(local_1100);
  iVar4 = 1;
LAB_001063be:
  if (local_ff8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_ff8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_11a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00106400:
  sptk::MelCepstrumPowerNormalization::Buffer::~Buffer((Buffer *)local_d78);
  local_1d0._vptr_MelCepstrumPowerNormalization =
       (_func_int **)&PTR__MelCepstrumPowerNormalization_0011f3d8;
  local_1d0.cepstrum_to_autocorrelation_._vptr_CepstrumToAutocorrelation =
       (_func_int **)&PTR__CepstrumToAutocorrelation_0011f408;
  sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
            (&local_1d0.cepstrum_to_autocorrelation_.fast_fourier_transform_);
LAB_0010600f:
  sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer((Buffer *)local_c70);
  sptk::MelGeneralizedCepstralAnalysis::~MelGeneralizedCepstralAnalysis(&local_fe0);
LAB_00106029:
  local_4e0._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1c8;
  sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_4e0.buffer_);
  sptk::WaveformToSpectrum::~WaveformToSpectrum(&local_120);
LAB_00106046:
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_420);
LAB_00106053:
  std::ifstream::~ifstream(&local_3d8);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);
  double gamma(kDefaultGamma);
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  int impulse_response_length(kDefaultImpulseResponseLength);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:l:q:o:i:d:e:E:n:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 0.0]";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        gamma = (0 == tmp) ? 0.0 : -1.0 / tmp;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &impulse_response_length) ||
            impulse_response_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelGeneralizedCepstralAnalysis analysis(fft_length, num_order, alpha,
                                                gamma, num_iteration,
                                                convergence_threshold);
  sptk::MelGeneralizedCepstralAnalysis::Buffer buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for cepstral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for output formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::GeneralizedCepstrumGainNormalization
      generalized_cepstrum_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for gain normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumPowerNormalization mel_cepstrum_power_normalization(
      num_order, impulse_response_length, alpha);
  sptk::MelCepstrumPowerNormalization::Buffer buffer_for_power_normalization;
  if (!mel_cepstrum_power_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for power normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double power;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral analysis";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }

    // mc -> b
    if (0.0 != alpha &&
        (kMlsaFilterCoefficients == output_format ||
         kGainNormalizedMlsaFilterCoefficients == output_format)) {
      if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to convert to MLSA filter coefficients";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // gnorm
    if (kGainNormalizedCepstrum == output_format ||
        kGainNormalizedMlsaFilterCoefficients == output_format) {
      if (!generalized_cepstrum_gain_normalization.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to gain-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // pnorm
    if (kPowerNormalizedCepstrum == output_format) {
      if (!mel_cepstrum_power_normalization.Run(
              &output, &power, &buffer_for_power_normalization)) {
        std::ostringstream error_message;
        error_message << "Failed to power-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
      if (!sptk::WriteStream(power, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write power";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }

  return 0;
}